

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::FastWriter::FastWriter(FastWriter *this)

{
  FastWriter *this_local;
  
  Writer::Writer(&this->super_Writer);
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__FastWriter_00daa378;
  std::__cxx11::string::string((string *)&this->document_);
  this->yamlCompatiblityEnabled_ = false;
  this->dropNullPlaceholders_ = false;
  this->omitEndingLineFeed_ = false;
  return;
}

Assistant:

FastWriter::FastWriter()
    : yamlCompatiblityEnabled_(false), dropNullPlaceholders_(false),
      omitEndingLineFeed_(false) {}